

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

void GD::save_load_regressor<sparse_parameters>
               (vw *all,io_buf *model_file,bool read,bool text,sparse_parameters *weights)

{
  float fVar1;
  weight *pwVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  size_t sVar5;
  size_t sVar6;
  vw_exception *this;
  byte bVar7;
  uint uVar8;
  uint64_t *data;
  __node_base *p_Var9;
  uint32_t old_i;
  uint64_t i;
  string local_1d8;
  stringstream msg;
  ostream local_1a8;
  
  if (all->print_invert == true) {
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    for (p_Var4 = (all->name_index_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(all->name_index_map)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      pwVar2 = sparse_parameters::strided_index(weights,*(size_t *)(p_Var4 + 2));
      if ((*pwVar2 != 0.0) || (NAN(*pwVar2))) {
        std::operator<<(&local_1a8,(string *)(p_Var4 + 1));
        bin_text_write_fixed(model_file,*(char **)(p_Var4 + 1),1,&msg,true);
        poVar3 = std::operator<<(&local_1a8,":");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pwVar2);
        std::operator<<(poVar3,"\n");
        bin_text_write_fixed(model_file,(char *)pwVar2,4,&msg,true);
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
  }
  else {
    i = 0;
    old_i = 0;
    uVar8 = all->num_bits;
    bVar7 = (byte)uVar8;
    if (read) {
      while( true ) {
        if (uVar8 < 0x1f) {
          sVar5 = io_buf::bin_read_fixed(model_file,(char *)&old_i,4,"");
          i = (uint64_t)old_i;
        }
        else {
          sVar5 = io_buf::bin_read_fixed(model_file,(char *)&i,8,"");
        }
        if (sVar5 == 0) break;
        if ((ulong)(1L << (bVar7 & 0x3f)) <= i) {
          std::__cxx11::stringstream::stringstream((stringstream *)&msg);
          poVar3 = std::operator<<(&local_1a8,"Model content is corrupted, weight vector index ");
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          poVar3 = std::operator<<(poVar3," must be less than total vector length ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          this = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (this,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/gd.cc"
                     ,0x2da,&local_1d8);
          __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        pwVar2 = sparse_parameters::strided_index(weights,i);
        sVar6 = io_buf::bin_read_fixed(model_file,(char *)pwVar2,4,"");
        if (sVar5 + sVar6 == 0) {
          return;
        }
        uVar8 = all->num_bits;
      }
    }
    else {
      p_Var9 = &(weights->_map)._M_h._M_before_begin;
      while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
        fVar1 = *(float *)&(*(_Hash_node_base **)
                             &((_Prime_rehash_policy *)(p_Var9 + 2))->_M_max_load_factor)->_M_nxt;
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          i = (ulong)p_Var9[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f);
          std::__cxx11::stringstream::stringstream((stringstream *)&msg);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          data = &i;
          sVar5 = 8;
          if (all->num_bits < 0x1f) {
            old_i = (uint32_t)i;
            data = (uint64_t *)&old_i;
            sVar5 = 4;
          }
          bin_text_write_fixed(model_file,(char *)data,sVar5,&msg,text);
          poVar3 = std::operator<<(&local_1a8,":");
          poVar3 = (ostream *)
                   std::ostream::operator<<
                             (poVar3,*(float *)&(*(_Hash_node_base **)
                                                  &((_Prime_rehash_policy *)(p_Var9 + 2))->
                                                   _M_max_load_factor)->_M_nxt);
          std::operator<<(poVar3,"\n");
          bin_text_write_fixed
                    (model_file,
                     (char *)*(_Hash_node_base **)
                              &((_Prime_rehash_policy *)(p_Var9 + 2))->_M_max_load_factor,4,&msg,
                     text);
          std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
        }
      }
    }
  }
  return;
}

Assistant:

void save_load_regressor(vw& all, io_buf& model_file, bool read, bool text, T& weights)
{
  size_t brw = 1;

  if (all.print_invert)  // write readable model with feature names
  {
    stringstream msg;
    typedef std::map<std::string, size_t> str_int_map;

    for (str_int_map::iterator it = all.name_index_map.begin(); it != all.name_index_map.end(); ++it)
    {
      weight* v = &weights.strided_index(it->second);
      if (*v != 0.)
      {
        msg << it->first;
        brw = bin_text_write_fixed(model_file, (char*)it->first.c_str(), sizeof(*it->first.c_str()), msg, true);

        msg << ":" << it->second << ":" << *v << "\n";
        bin_text_write_fixed(model_file, (char*)&(*v), sizeof(*v), msg, true);
      }
    }
    return;
  }

  uint64_t i = 0;
  uint32_t old_i = 0;
  uint64_t length = (uint64_t)1 << all.num_bits;
  if (read)
    do
    {
      brw = 1;
      if (all.num_bits < 31)  // backwards compatible
      {
        brw = model_file.bin_read_fixed((char*)&old_i, sizeof(old_i), "");
        i = old_i;
      }
      else
        brw = model_file.bin_read_fixed((char*)&i, sizeof(i), "");
      if (brw > 0)
      {
        if (i >= length)
          THROW("Model content is corrupted, weight vector index " << i << " must be less than total vector length "
                                                                   << length);
        weight* v = &weights.strided_index(i);
        brw += model_file.bin_read_fixed((char*)&(*v), sizeof(*v), "");
      }
    } while (brw > 0);
  else  // write
    for (typename T::iterator v = weights.begin(); v != weights.end(); ++v)
      if (*v != 0.)
      {
        i = v.index() >> weights.stride_shift();
        stringstream msg;
        msg << i;

        if (all.num_bits < 31)
        {
          old_i = (uint32_t)i;
          brw = bin_text_write_fixed(model_file, (char*)&old_i, sizeof(old_i), msg, text);
        }
        else
          brw = bin_text_write_fixed(model_file, (char*)&i, sizeof(i), msg, text);

        msg << ":" << *v << "\n";
        brw += bin_text_write_fixed(model_file, (char*)&(*v), sizeof(*v), msg, text);
      }
}